

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImFormatString(char *buf,size_t buf_size,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [24];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  int local_4c;
  undefined4 local_48;
  int w;
  va_list args;
  char *fmt_local;
  size_t buf_size_local;
  char *buf_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_108;
  args[0]._0_8_ = &stack0x00000008;
  w = 0x30;
  local_48 = 0x18;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  local_4c = vsnprintf(buf,buf_size,fmt,&local_48);
  buf_local._4_4_ = local_4c;
  if (buf != (char *)0x0) {
    if ((local_4c == -1) || ((int)buf_size <= local_4c)) {
      local_4c = (int)buf_size + -1;
    }
    buf[local_4c] = '\0';
    buf_local._4_4_ = local_4c;
  }
  return buf_local._4_4_;
}

Assistant:

int ImFormatString(char* buf, size_t buf_size, const char* fmt, ...)
{
    va_list args;
    va_start(args, fmt);
    int w = vsnprintf(buf, buf_size, fmt, args);
    va_end(args);
    if (buf == NULL)
        return w;
    if (w == -1 || w >= (int)buf_size)
        w = (int)buf_size - 1;
    buf[w] = 0;
    return w;
}